

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O2

int av1_get_reference_mode_context(MACROBLOCKD *xd)

{
  _Bool _Var1;
  char cVar2;
  byte bVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  
  pMVar4 = xd->above_mbmi;
  pMVar5 = xd->left_mbmi;
  _Var1 = xd->up_available;
  if ((_Var1 & xd->left_available) == 1) {
    if (pMVar4->ref_frame[1] < '\x01') {
      cVar2 = pMVar4->ref_frame[0];
      if (pMVar5->ref_frame[1] < '\x01') {
        return (int)((byte)(pMVar5->ref_frame[0] - 5U) < 3 != (byte)(cVar2 - 5U) < 3);
      }
      if (2 < (byte)(cVar2 - 5U)) {
        bVar3 = pMVar4->field_0xa7;
        goto LAB_0032d01c;
      }
    }
    else {
      if ('\0' < pMVar5->ref_frame[1]) {
        return 4;
      }
      cVar2 = pMVar5->ref_frame[0];
      if (2 < (byte)(cVar2 - 5U)) {
        bVar3 = pMVar5->field_0xa7;
LAB_0032d01c:
        return (byte)('\0' < cVar2 | bVar3 >> 7) ^ 3;
      }
    }
  }
  else {
    if (((xd->left_available | _Var1) & 1U) == 0) {
      return 1;
    }
    if (_Var1 != false) {
      pMVar5 = pMVar4;
    }
    if (pMVar5->ref_frame[1] < '\x01') {
      return (int)((byte)(pMVar5->ref_frame[0] - 5U) < 3);
    }
  }
  return 3;
}

Assistant:

int av1_get_reference_mode_context(const MACROBLOCKD *xd) {
  int ctx;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  // Note:
  // The mode info data structure has a one element border above and to the
  // left of the entries corresponding to real macroblocks.
  // The prediction flags in these dummy entries are initialized to 0.
  if (has_above && has_left) {  // both edges available
    if (!has_second_ref(above_mbmi) && !has_second_ref(left_mbmi))
      // neither edge uses comp pred (0/1)
      ctx = IS_BACKWARD_REF_FRAME(above_mbmi->ref_frame[0]) ^
            IS_BACKWARD_REF_FRAME(left_mbmi->ref_frame[0]);
    else if (!has_second_ref(above_mbmi))
      // one of two edges uses comp pred (2/3)
      ctx = 2 + (IS_BACKWARD_REF_FRAME(above_mbmi->ref_frame[0]) ||
                 !is_inter_block(above_mbmi));
    else if (!has_second_ref(left_mbmi))
      // one of two edges uses comp pred (2/3)
      ctx = 2 + (IS_BACKWARD_REF_FRAME(left_mbmi->ref_frame[0]) ||
                 !is_inter_block(left_mbmi));
    else  // both edges use comp pred (4)
      ctx = 4;
  } else if (has_above || has_left) {  // one edge available
    const MB_MODE_INFO *edge_mbmi = has_above ? above_mbmi : left_mbmi;

    if (!has_second_ref(edge_mbmi))
      // edge does not use comp pred (0/1)
      ctx = IS_BACKWARD_REF_FRAME(edge_mbmi->ref_frame[0]);
    else
      // edge uses comp pred (3)
      ctx = 3;
  } else {  // no edges available (1)
    ctx = 1;
  }
  assert(ctx >= 0 && ctx < COMP_INTER_CONTEXTS);
  return ctx;
}